

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O3

Split * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL>::find_template<false>
          (Split *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,PrimInfoRange *set,
          size_t logBlockSize,LinearSpace3fa *space)

{
  BBox3fa *pBVar1;
  int *piVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  Scene *pSVar5;
  PrimRef *pPVar6;
  Geometry *pGVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  float fVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  float *pfVar23;
  float fVar24;
  int iVar25;
  int iVar27;
  int iVar28;
  undefined1 auVar26 [16];
  int iVar29;
  undefined1 auVar30 [16];
  float fVar31;
  uint uVar32;
  float fVar35;
  uint uVar36;
  float fVar37;
  uint uVar38;
  undefined1 auVar33 [16];
  float fVar39;
  undefined1 auVar34 [16];
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar45;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar46;
  uint uVar47;
  float fVar48;
  float fVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  undefined1 auVar54 [16];
  float fVar56;
  undefined1 auVar55 [16];
  float fVar57;
  float fVar58;
  undefined1 auVar59 [16];
  BinBoundsAndCenter binBoundsAndCenter;
  BBox3fa bounds;
  Binner binner;
  vuint4 rCounts [32];
  undefined1 local_1380 [16];
  undefined1 local_1370 [8];
  float fStack_1368;
  float fStack_1364;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined1 local_12e0 [16];
  uint local_12d0 [4];
  undefined1 local_12c0 [16];
  size_t local_12b0;
  float local_1290 [7];
  float fStack_1274;
  float local_1270 [120];
  undefined1 auStack_1090 [16];
  undefined8 local_1080 [2];
  undefined1 local_1070 [16];
  undefined1 local_1060 [16];
  undefined1 local_1050 [16];
  undefined1 local_1040 [16];
  undefined1 local_1030 [2976];
  int aiStack_490 [4];
  undefined8 local_480;
  int aiStack_478 [122];
  int aiStack_290 [8];
  int aiStack_270 [144];
  
  lVar13 = 0xc00;
  pauVar17 = (undefined1 (*) [16])local_1030;
  do {
    pauVar17[-1] = _DAT_01f7a9f0;
    *pauVar17 = _DAT_01f7aa00;
    pauVar17[-3] = _DAT_01f7a9f0;
    pauVar17[-2] = _DAT_01f7aa00;
    pauVar17[-5] = _DAT_01f7a9f0;
    pauVar17[-4] = _DAT_01f7aa00;
    *(undefined8 *)((long)local_1080 + lVar13) = 0;
    *(undefined8 *)((long)local_1080 + lVar13 + 8) = 0;
    lVar13 = lVar13 + 0x10;
    pauVar17 = pauVar17 + 6;
  } while (lVar13 != 0xe00);
  uVar3 = (set->super_range<unsigned_long>)._begin;
  uVar4 = (set->super_range<unsigned_long>)._end;
  fVar24 = (float)(uVar4 - uVar3) * 0.05 + 4.0;
  uVar14 = (ulong)fVar24;
  uVar14 = (long)(fVar24 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
  sVar22 = 0x20;
  if (uVar14 < 0x20) {
    sVar22 = uVar14;
  }
  pBVar1 = &(set->super_CentGeomBBox3fa).centBounds;
  fVar24 = (pBVar1->lower).field_0.m128[0];
  fVar46 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[1];
  uVar10 = *(undefined8 *)&(pBVar1->lower).field_0;
  pfVar23 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128 + 2;
  fVar48 = *pfVar23;
  fVar49 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[3];
  uVar11 = *(undefined8 *)pfVar23;
  auVar26._0_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[0] - fVar24;
  auVar26._4_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[1] - fVar46;
  auVar26._8_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[2] - fVar48;
  auVar26._12_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[3] - fVar49;
  auVar33 = maxps(_DAT_01f7bb10,auVar26);
  auVar43._0_4_ = (float)(long)sVar22 * 0.99;
  auVar43._4_4_ = auVar43._0_4_;
  auVar43._8_4_ = auVar43._0_4_;
  auVar43._12_4_ = auVar43._0_4_;
  auVar26 = divps(auVar43,auVar33);
  fVar31 = (float)(-(uint)((float)DAT_01f7bb10 < auVar33._0_4_) & auVar26._0_4_);
  fVar35 = (float)(-(uint)(DAT_01f7bb10._4_4_ < auVar33._4_4_) & auVar26._4_4_);
  fVar37 = (float)(-(uint)(DAT_01f7bb10._8_4_ < auVar33._8_4_) & auVar26._8_4_);
  fVar39 = (float)(-(uint)(DAT_01f7bb10._12_4_ < auVar33._12_4_) & auVar26._12_4_);
  local_1290[0] = fVar31;
  local_1290[1] = fVar35;
  local_1290[2] = fVar37;
  pSVar5 = this->scene;
  local_1310 = *(undefined8 *)&(space->vx).field_0;
  uStack_1308 = *(undefined8 *)((long)&(space->vx).field_0 + 8);
  local_1300 = *(undefined8 *)&(space->vy).field_0;
  uStack_12f8 = *(undefined8 *)((long)&(space->vy).field_0 + 8);
  local_12f0 = *(undefined8 *)&(space->vz).field_0;
  uStack_12e8 = *(undefined8 *)((long)&(space->vz).field_0 + 8);
  uVar20 = uVar4 - uVar3;
  if (uVar20 != 0) {
    pPVar6 = this->prims;
    local_12b0 = sVar22;
    local_1290[3] = fVar39;
    if (uVar20 == 1) {
      uVar21 = 0;
    }
    else {
      local_1380._4_4_ = (int)sVar22 - 1;
      local_1380._0_4_ = local_1380._4_4_;
      local_1380._8_4_ = local_1380._4_4_;
      local_1380._12_4_ = local_1380._4_4_;
      pfVar23 = pPVar6[uVar3 + 1].upper.field_0.m128 + 3;
      uVar21 = 0;
      do {
        pGVar7 = (pSVar5->geometries).items[(uint)pfVar23[-0xc]].ptr;
        (*(pGVar7->super_RefCount)._vptr_RefCount[0x3a])
                  (local_1290 + 4,pGVar7,&local_1310,(ulong)(uint)pfVar23[-8]);
        fVar12 = local_1270[3];
        fVar58 = local_1270[2];
        fVar57 = local_1270[1];
        fVar56 = local_1270[0];
        local_1370._4_4_ = local_1290[5];
        local_1370._0_4_ = local_1290[4];
        fStack_1368 = local_1290[6];
        fStack_1364 = fStack_1274;
        auVar55._0_4_ = (int)(((local_1290[4] + local_1270[0]) - fVar24) * fVar31 + -0.5);
        auVar55._4_4_ = (int)(((local_1290[5] + local_1270[1]) - fVar46) * fVar35 + -0.5);
        auVar55._8_4_ = (int)(((local_1290[6] + local_1270[2]) - fVar48) * fVar37 + -0.5);
        auVar55._12_4_ = (int)(((fStack_1274 + local_1270[3]) - fVar49) * fVar39 + -0.5);
        auVar30._0_4_ = -(uint)((int)local_1380._4_4_ < auVar55._0_4_);
        auVar30._4_4_ = -(uint)((int)local_1380._4_4_ < auVar55._4_4_);
        auVar30._8_4_ = -(uint)((int)local_1380._4_4_ < auVar55._8_4_);
        auVar30._12_4_ = -(uint)((int)local_1380._4_4_ < auVar55._12_4_);
        local_12e0 = ~auVar30 & auVar55 | local_1380 & auVar30;
        auVar34._0_4_ = -(uint)(0 < local_12e0._0_4_);
        auVar34._4_4_ = -(uint)(0 < local_12e0._4_4_);
        auVar34._8_4_ = -(uint)(0 < local_12e0._8_4_);
        auVar34._12_4_ = -(uint)(0 < local_12e0._12_4_);
        local_12e0 = auVar34 & local_12e0;
        pGVar7 = (pSVar5->geometries).items[(uint)pfVar23[-4]].ptr;
        (*(pGVar7->super_RefCount)._vptr_RefCount[0x3a])
                  (local_1290 + 4,pGVar7,&local_1310,(ulong)(uint)*pfVar23);
        auVar44._4_4_ = local_1290[5];
        auVar44._0_4_ = local_1290[4];
        auVar44._8_4_ = local_1290[6];
        auVar44._12_4_ = fStack_1274;
        auVar54._4_4_ = local_1270[1];
        auVar54._0_4_ = local_1270[0];
        auVar54._8_4_ = local_1270[2];
        auVar54._12_4_ = local_1270[3];
        uVar15 = (ulong)(uint)local_12e0._0_4_;
        *(int *)(&local_480 + uVar15 * 2) = *(int *)(&local_480 + uVar15 * 2) + 1;
        auVar26 = minps(*(undefined1 (*) [16])(local_1080 + uVar15 * 0xc),_local_1370);
        auVar33._4_4_ = fVar57;
        auVar33._0_4_ = fVar56;
        auVar33._8_4_ = fVar58;
        auVar33._12_4_ = fVar12;
        auVar43 = maxps(*(undefined1 (*) [16])(local_1070 + uVar15 * 0x60),auVar33);
        *(undefined1 (*) [16])(local_1080 + uVar15 * 0xc) = auVar26;
        lVar13 = (ulong)(uint)local_12e0._4_4_ * 0x60;
        *(undefined1 (*) [16])(local_1070 + uVar15 * 0x60) = auVar43;
        piVar2 = (int *)((long)&local_480 + (ulong)(uint)local_12e0._4_4_ * 0x10 + 4);
        *piVar2 = *piVar2 + 1;
        uVar32 = (uint)(((local_1290[4] + local_1270[0]) - fVar24) * fVar31 + -0.5);
        uVar36 = (uint)(((local_1290[5] + local_1270[1]) - fVar46) * fVar35 + -0.5);
        uVar38 = (uint)(((local_1290[6] + local_1270[2]) - fVar48) * fVar37 + -0.5);
        auVar26 = minps(*(undefined1 (*) [16])(local_1060 + lVar13),_local_1370);
        *(undefined1 (*) [16])(local_1060 + lVar13) = auVar26;
        auVar26 = maxps(*(undefined1 (*) [16])(local_1050 + lVar13),auVar33);
        uVar40 = -(uint)((int)local_1380._4_4_ < (int)uVar32);
        uVar41 = -(uint)((int)local_1380._4_4_ < (int)uVar36);
        uVar42 = -(uint)((int)local_1380._4_4_ < (int)uVar38);
        *(undefined1 (*) [16])(local_1050 + lVar13) = auVar26;
        lVar13 = (ulong)(uint)local_12e0._8_4_ * 0x60;
        aiStack_478[(ulong)(uint)local_12e0._8_4_ * 4] =
             aiStack_478[(ulong)(uint)local_12e0._8_4_ * 4] + 1;
        uVar32 = ~uVar40 & uVar32 | local_1380._4_4_ & uVar40;
        uVar36 = ~uVar41 & uVar36 | local_1380._4_4_ & uVar41;
        uVar38 = ~uVar42 & uVar38 | local_1380._4_4_ & uVar42;
        auVar43 = minps(*(undefined1 (*) [16])(local_1040 + lVar13),_local_1370);
        auVar26 = maxps(*(undefined1 (*) [16])(local_1030 + lVar13),auVar33);
        *(undefined1 (*) [16])(local_1040 + lVar13) = auVar43;
        uVar16 = (ulong)(-(uint)(0 < (int)uVar32) & uVar32);
        *(undefined1 (*) [16])(local_1030 + lVar13) = auVar26;
        *(int *)(&local_480 + uVar16 * 2) = *(int *)(&local_480 + uVar16 * 2) + 1;
        auVar26 = minps(*(undefined1 (*) [16])(local_1080 + uVar16 * 0xc),auVar44);
        auVar43 = maxps(*(undefined1 (*) [16])(local_1070 + uVar16 * 0x60),auVar54);
        *(undefined1 (*) [16])(local_1080 + uVar16 * 0xc) = auVar26;
        uVar15 = (ulong)(-(uint)(0 < (int)uVar36) & uVar36);
        lVar13 = uVar15 * 0x60;
        *(undefined1 (*) [16])(local_1070 + uVar16 * 0x60) = auVar43;
        piVar2 = (int *)((long)&local_480 + uVar15 * 0x10 + 4);
        *piVar2 = *piVar2 + 1;
        auVar26 = minps(*(undefined1 (*) [16])(local_1060 + lVar13),auVar44);
        auVar43 = maxps(*(undefined1 (*) [16])(local_1050 + lVar13),auVar54);
        *(undefined1 (*) [16])(local_1060 + lVar13) = auVar26;
        uVar15 = (ulong)(-(uint)(0 < (int)uVar38) & uVar38);
        lVar18 = uVar15 * 0x60;
        *(undefined1 (*) [16])(local_1050 + lVar13) = auVar43;
        aiStack_478[uVar15 * 4] = aiStack_478[uVar15 * 4] + 1;
        auVar26 = minps(*(undefined1 (*) [16])(local_1040 + lVar18),auVar44);
        auVar43 = maxps(*(undefined1 (*) [16])(local_1030 + lVar18),auVar54);
        *(undefined1 (*) [16])(local_1040 + lVar18) = auVar26;
        *(undefined1 (*) [16])(local_1030 + lVar18) = auVar43;
        uVar21 = uVar21 + 2;
        pfVar23 = pfVar23 + 0x10;
      } while (uVar21 < uVar20 - 1);
    }
    if (uVar21 < uVar20) {
      pGVar7 = (pSVar5->geometries).items[(uint)pPVar6[uVar3 + uVar21].lower.field_0.m128[3]].ptr;
      (*(pGVar7->super_RefCount)._vptr_RefCount[0x3a])
                (local_1290 + 4,pGVar7,&local_1310,
                 (ulong)(uint)pPVar6[uVar3 + uVar21].upper.field_0.m128[3]);
      auVar8._4_4_ = local_1290[5];
      auVar8._0_4_ = local_1290[4];
      auVar8._8_4_ = local_1290[6];
      auVar8._12_4_ = fStack_1274;
      auVar9._4_4_ = local_1270[1];
      auVar9._0_4_ = local_1270[0];
      auVar9._8_4_ = local_1270[2];
      auVar9._12_4_ = local_1270[3];
      uVar36 = (uint)(((local_1290[4] + local_1270[0]) - fVar24) * fVar31 + -0.5);
      uVar38 = (uint)(((local_1290[5] + local_1270[1]) - fVar46) * fVar35 + -0.5);
      uVar40 = (uint)(((local_1290[6] + local_1270[2]) - fVar48) * fVar37 + -0.5);
      uVar32 = (int)sVar22 - 1;
      uVar41 = -(uint)((int)uVar32 < (int)uVar36);
      uVar42 = -(uint)((int)uVar32 < (int)uVar38);
      uVar45 = -(uint)((int)uVar32 < (int)uVar40);
      uVar36 = ~uVar41 & uVar36 | uVar32 & uVar41;
      uVar38 = ~uVar42 & uVar38 | uVar32 & uVar42;
      uVar32 = ~uVar45 & uVar40 | uVar32 & uVar45;
      uVar20 = (ulong)(-(uint)(0 < (int)uVar36) & uVar36);
      *(int *)(&local_480 + uVar20 * 2) = *(int *)(&local_480 + uVar20 * 2) + 1;
      auVar26 = *(undefined1 (*) [16])(local_1070 + uVar20 * 0x60);
      auVar43 = minps(*(undefined1 (*) [16])(local_1080 + uVar20 * 0xc),auVar8);
      *(undefined1 (*) [16])(local_1080 + uVar20 * 0xc) = auVar43;
      auVar26 = maxps(auVar26,auVar9);
      *(undefined1 (*) [16])(local_1070 + uVar20 * 0x60) = auVar26;
      uVar20 = (ulong)(-(uint)(0 < (int)uVar38) & uVar38);
      lVar13 = uVar20 * 0x60;
      piVar2 = (int *)((long)&local_480 + uVar20 * 0x10 + 4);
      *piVar2 = *piVar2 + 1;
      auVar26 = minps(*(undefined1 (*) [16])(local_1060 + lVar13),auVar8);
      *(undefined1 (*) [16])(local_1060 + lVar13) = auVar26;
      auVar26 = maxps(*(undefined1 (*) [16])(local_1050 + lVar13),auVar9);
      *(undefined1 (*) [16])(local_1050 + lVar13) = auVar26;
      uVar20 = (ulong)(-(uint)(0 < (int)uVar32) & uVar32);
      lVar13 = uVar20 * 0x60;
      aiStack_478[uVar20 * 4] = aiStack_478[uVar20 * 4] + 1;
      auVar26 = minps(*(undefined1 (*) [16])(local_1040 + lVar13),auVar8);
      *(undefined1 (*) [16])(local_1040 + lVar13) = auVar26;
      auVar26 = maxps(*(undefined1 (*) [16])(local_1030 + lVar13),auVar9);
      *(undefined1 (*) [16])(local_1030 + lVar13) = auVar26;
    }
  }
  lVar13 = sVar22 - 1;
  if (lVar13 != 0) {
    lVar18 = sVar22 * 0x10;
    pauVar17 = (undefined1 (*) [16])(auStack_1090 + sVar22 * 0x60);
    iVar25 = 0;
    iVar27 = 0;
    iVar28 = 0;
    iVar29 = 0;
    lVar19 = 0;
    auVar26 = _DAT_01f7aa00;
    auVar43 = _DAT_01f7a9f0;
    auVar33 = _DAT_01f7aa00;
    auVar44 = _DAT_01f7a9f0;
    auVar54 = _DAT_01f7a9f0;
    auVar55 = _DAT_01f7aa00;
    do {
      piVar2 = (int *)((long)aiStack_490 + lVar19 + lVar18);
      iVar25 = iVar25 + *piVar2;
      iVar27 = iVar27 + piVar2[1];
      iVar28 = iVar28 + piVar2[2];
      iVar29 = iVar29 + piVar2[3];
      auVar54 = minps(auVar54,pauVar17[-5]);
      auVar55 = maxps(auVar55,pauVar17[-4]);
      auVar43 = minps(auVar43,pauVar17[-3]);
      fVar24 = auVar55._4_4_ - auVar54._4_4_;
      fVar46 = auVar55._8_4_ - auVar54._8_4_;
      auVar26 = maxps(auVar26,pauVar17[-2]);
      fVar48 = auVar26._4_4_ - auVar43._4_4_;
      fVar49 = auVar26._8_4_ - auVar43._8_4_;
      auVar44 = minps(auVar44,pauVar17[-1]);
      auVar33 = maxps(auVar33,*pauVar17);
      *(ulong *)((long)local_1290 + lVar19 + lVar18) =
           CONCAT44((auVar26._0_4_ - auVar43._0_4_) * (fVar48 + fVar49) + fVar49 * fVar48,
                    (auVar55._0_4_ - auVar54._0_4_) * (fVar24 + fVar46) + fVar46 * fVar24);
      fVar24 = auVar33._4_4_ - auVar44._4_4_;
      fVar46 = auVar33._8_4_ - auVar44._8_4_;
      *(float *)((long)local_1290 + lVar19 + lVar18 + 8) =
           (fVar24 + fVar46) * (auVar33._0_4_ - auVar44._0_4_) + fVar46 * fVar24;
      *(undefined4 *)((long)local_1290 + lVar19 + lVar18 + 0xc) = 0;
      piVar2 = (int *)((long)aiStack_290 + lVar19 + lVar18);
      *piVar2 = iVar25;
      piVar2[1] = iVar27;
      piVar2[2] = iVar28;
      piVar2[3] = iVar29;
      lVar19 = lVar19 + -0x10;
      pauVar17 = pauVar17 + -6;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  uVar20 = 0xffffffffffffffff;
  local_12c0 = _DAT_01f7a9f0;
  if (uVar14 < 2) {
    local_12d0[0] = 0;
    local_12d0[1] = 0;
    local_12d0[2] = 0;
  }
  else {
    uVar32 = ~(-1 << ((byte)logBlockSize & 0x1f));
    pauVar17 = (undefined1 (*) [16])local_1030;
    uVar36 = 1;
    uVar38 = 1;
    uVar40 = 1;
    iVar25 = 0;
    iVar27 = 0;
    iVar28 = 0;
    iVar29 = 0;
    lVar13 = 0;
    local_12d0[0] = 0;
    local_12d0[1] = 0;
    local_12d0[2] = 0;
    auVar26 = _DAT_01f7aa00;
    auVar43 = _DAT_01f7a9f0;
    auVar33 = _DAT_01f7aa00;
    auVar44 = _DAT_01f7aa00;
    auVar54 = _DAT_01f7a9f0;
    auVar55 = _DAT_01f7a9f0;
    do {
      auVar43 = minps(auVar43,pauVar17[-5]);
      auVar26 = maxps(auVar26,pauVar17[-4]);
      auVar54 = minps(auVar54,pauVar17[-3]);
      auVar44 = maxps(auVar44,pauVar17[-2]);
      fVar57 = auVar26._4_4_ - auVar43._4_4_;
      fVar58 = auVar26._8_4_ - auVar43._8_4_;
      auVar55 = minps(auVar55,pauVar17[-1]);
      fVar24 = auVar44._4_4_ - auVar54._4_4_;
      fVar46 = auVar44._8_4_ - auVar54._8_4_;
      auVar33 = maxps(auVar33,*pauVar17);
      fVar48 = auVar33._0_4_ - auVar55._0_4_;
      fVar49 = auVar33._4_4_ - auVar55._4_4_;
      fVar56 = auVar33._8_4_ - auVar55._8_4_;
      iVar25 = iVar25 + *(int *)((long)&local_480 + lVar13);
      iVar27 = iVar27 + *(int *)((long)&local_480 + lVar13 + 4);
      iVar28 = iVar28 + *(int *)((long)aiStack_478 + lVar13);
      iVar29 = iVar29 + *(int *)((long)aiStack_478 + lVar13 + 4);
      local_1370 = (undefined1  [8])(logBlockSize & 0xffffffff);
      uVar41 = iVar25 + uVar32 >> (long)local_1370;
      uVar42 = iVar27 + uVar32 >> (long)local_1370;
      uVar45 = iVar28 + uVar32 >> (long)local_1370;
      uVar47 = iVar29 + uVar32 >> (long)local_1370;
      uVar50 = *(int *)((long)aiStack_270 + lVar13) + uVar32 >> (long)local_1370;
      uVar51 = *(int *)((long)aiStack_270 + lVar13 + 4) + uVar32 >> (long)local_1370;
      uVar52 = *(int *)((long)aiStack_270 + lVar13 + 8) + uVar32 >> (long)local_1370;
      uVar53 = *(int *)((long)aiStack_270 + lVar13 + 0xc) + uVar32 >> (long)local_1370;
      auVar59._0_4_ =
           ((float)(uVar50 & 0x7fffffff) + (float)((int)uVar50 >> 0x1f & 0x4f000000)) *
           *(float *)((long)local_1270 + lVar13) +
           ((float)(uVar41 & 0x7fffffff) + (float)((int)uVar41 >> 0x1f & 0x4f000000)) *
           ((auVar26._0_4_ - auVar43._0_4_) * (fVar57 + fVar58) + fVar58 * fVar57);
      auVar59._4_4_ =
           ((float)(uVar51 & 0x7fffffff) + (float)((int)uVar51 >> 0x1f & 0x4f000000)) *
           *(float *)((long)local_1270 + lVar13 + 4) +
           ((float)(uVar42 & 0x7fffffff) + (float)((int)uVar42 >> 0x1f & 0x4f000000)) *
           ((auVar44._0_4_ - auVar54._0_4_) * (fVar24 + fVar46) + fVar46 * fVar24);
      auVar59._8_4_ =
           ((float)(uVar52 & 0x7fffffff) + (float)((int)uVar52 >> 0x1f & 0x4f000000)) *
           *(float *)((long)local_1270 + lVar13 + 8) +
           ((float)(uVar45 & 0x7fffffff) + (float)((int)uVar45 >> 0x1f & 0x4f000000)) *
           (fVar48 * (fVar56 + fVar49) + fVar49 * fVar56);
      auVar59._12_4_ =
           ((float)(uVar53 & 0x7fffffff) + (float)((int)uVar53 >> 0x1f & 0x4f000000)) *
           *(float *)((long)local_1270 + lVar13 + 0xc) +
           ((float)(uVar47 & 0x7fffffff) + (float)((int)uVar47 >> 0x1f & 0x4f000000)) *
           (fVar48 * (fVar49 + fVar56) + fVar56 * fVar49);
      uVar41 = -(uint)(local_12c0._0_4_ <= auVar59._0_4_);
      uVar42 = -(uint)(local_12c0._4_4_ <= auVar59._4_4_);
      uVar45 = -(uint)(local_12c0._8_4_ <= auVar59._8_4_);
      local_12d0[0] = ~uVar41 & uVar36 | local_12d0[0] & uVar41;
      local_12d0[1] = ~uVar42 & uVar38 | local_12d0[1] & uVar42;
      local_12d0[2] = ~uVar45 & uVar40 | local_12d0[2] & uVar45;
      local_12c0 = minps(auVar59,local_12c0);
      uVar36 = uVar36 + 1;
      uVar38 = uVar38 + 1;
      uVar40 = uVar40 + 1;
      pauVar17 = pauVar17 + 6;
      lVar13 = lVar13 + 0x10;
    } while (sVar22 * 0x10 + -0x10 != lVar13);
  }
  fVar24 = INFINITY;
  uVar14 = 0;
  uVar32 = 0;
  do {
    if ((((local_1290[uVar14] != 0.0) || (NAN(local_1290[uVar14]))) &&
        (*(float *)(local_12c0 + uVar14 * 4) < fVar24)) && (local_12d0[uVar14] != 0)) {
      uVar20 = uVar14 & 0xffffffff;
      uVar32 = local_12d0[uVar14];
      fVar24 = *(float *)(local_12c0 + uVar14 * 4);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 3);
  __return_storage_ptr__->sah = fVar24;
  __return_storage_ptr__->dim = (int)uVar20;
  (__return_storage_ptr__->field_2).pos = uVar32;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = sVar22;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = uVar10;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar11;
  *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 = CONCAT44(fVar35,fVar31);
  *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = CONCAT44(fVar39,fVar37);
  return __return_storage_ptr__;
}

Assistant:

const Split find_template(const PrimInfoRange& set, const size_t logBlockSize, const LinearSpace3fa& space)
        {
          Binner binner(empty);
          const BinMapping<BINS> mapping(set);
          BinBoundsAndCenter binBoundsAndCenter(scene,space);
          bin_serial_or_parallel<parallel>(binner,prims,set.begin(),set.end(),size_t(4096),mapping,binBoundsAndCenter);
          return binner.best(mapping,logBlockSize);
        }